

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void print_summary(OSQPWorkspace *work)

{
  OSQPInfo *pOVar1;
  
  pOVar1 = work->info;
  printf("%4i",(ulong)(uint)pOVar1->iter);
  printf(" %12.4e",pOVar1->obj_val);
  printf("  %9.2e",pOVar1->pri_res);
  printf("  %9.2e",pOVar1->dua_res);
  printf("  %9.2e",work->settings->rho);
  printf("  %9.2es",
         *(double *)(pOVar1->status + (ulong)(work->first_run == 0) * 0x10 + 0x48) +
         pOVar1->solve_time);
  putchar(10);
  work->summary_printed = 1;
  return;
}

Assistant:

void print_summary(OSQPWorkspace *work) {
  OSQPInfo *info;

  info = work->info;

  c_print("%4i",     (int)info->iter);
  c_print(" %12.4e", info->obj_val);
  c_print("  %9.2e", info->pri_res);
  c_print("  %9.2e", info->dua_res);
  c_print("  %9.2e", work->settings->rho);
# ifdef PROFILING

  if (work->first_run) {
    // total time: setup + solve
    c_print("  %9.2es", info->setup_time + info->solve_time);
  } else {
    // total time: update + solve
    c_print("  %9.2es", info->update_time + info->solve_time);
  }
# endif /* ifdef PROFILING */
  c_print("\n");

  work->summary_printed = 1; // Summary has been printed
}